

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void google::protobuf::MessageFactory::InternalRegisterGeneratedMessage
               (Descriptor *descriptor,Message *prototype)

{
  GeneratedMessageFactory *this;
  Message *prototype_local;
  Descriptor *descriptor_local;
  
  this = anon_unknown_0::GeneratedMessageFactory::singleton();
  anon_unknown_0::GeneratedMessageFactory::RegisterType(this,descriptor,prototype);
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedMessage(
    const Descriptor* descriptor, const Message* prototype) {
  GeneratedMessageFactory::singleton()->RegisterType(descriptor, prototype);
}